

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_ConvertSignatureToDerHexEmpty_Test::TestBody
          (CryptoUtil_ConvertSignatureToDerHexEmpty_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  ByteData byte_data;
  undefined1 local_3c [8];
  SigHashType sig_type;
  string hex_sig;
  CryptoUtil_ConvertSignatureToDerHexEmpty_Test *this_local;
  
  std::__cxx11::string::string((string *)&sig_type.hash_algorithm_);
  cfd::core::SigHashType::SigHashType((SigHashType *)local_3c,kSigHashAll,false,false);
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)&cfd_except,(string *)&sig_type.hash_algorithm_,(SigHashType *)local_3c);
  cfd::core::ByteData::~ByteData((ByteData *)&cfd_except);
  std::__cxx11::string::~string((string *)&sig_type.hash_algorithm_);
  local_a1 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_a0,(AssertionResult *)0x6e96c0,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x219,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureToDerHexEmpty) {
  try {
    std::string hex_sig;
    SigHashType sig_type(SigHashAlgorithm::kSigHashAll);
    ByteData byte_data = CryptoUtil::ConvertSignatureToDer(hex_sig, sig_type);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "der encode error.");
    return;
  }
  ASSERT_TRUE(false);
}